

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void flatbuffers::anon_unknown_0::SingleValueRepack<long>(Value *e,long val)

{
  bool bVar1;
  string local_38;
  long local_18;
  long val_local;
  Value *e_local;
  
  local_18 = val;
  val_local = (long)e;
  bVar1 = IsInteger((e->type).base_type);
  if (bVar1) {
    NumToString<long>(&local_38,local_18);
    std::__cxx11::string::operator=((string *)(val_local + 0x20),(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

static inline void SingleValueRepack(Value &e, T val) {
  // Remove leading zeros.
  if (IsInteger(e.type.base_type)) { e.constant = NumToString(val); }
}